

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O2

void __thiscall
TransitionObservationIndependentMADPDiscrete::TransitionObservationIndependentMADPDiscrete
          (TransitionObservationIndependentMADPDiscrete *this,void **vtt,
          TransitionObservationIndependentMADPDiscrete *param_2)

{
  void *pvVar1;
  E *this_00;
  undefined1 auVar2 [32];
  undefined1 auVar3 [64];
  allocator<char> local_e3;
  allocator<char> local_e2;
  allocator<char> local_e1 [73];
  void **local_98;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"received unspec. by MultiAgentDecisionProcess",local_e1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"received unspec. by MultiAgentDecisionProcess",&local_e2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"received unspec. by MultiAgentDecisionProcess",&local_e3);
  MultiAgentDecisionProcess::MultiAgentDecisionProcess
            (&this->super_MultiAgentDecisionProcess,vtt + 1,&local_50,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pvVar1 = *vtt;
  *(void **)&this->super_MultiAgentDecisionProcess = pvVar1;
  *(void **)(&(this->super_MultiAgentDecisionProcess).field_0x0 + *(long *)((long)pvVar1 + -0x40)) =
       vtt[3];
  *(void **)(&(this->super_MultiAgentDecisionProcess).field_0x0 +
            *(long *)(*(long *)&this->super_MultiAgentDecisionProcess + -0x48)) = vtt[4];
  (this->_m_jointToIndActionCache).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_jointToIndActionCache).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_jointToIndActionCache).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_jointStates).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_jointStates).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_jointStates).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_jointToIndObsCache).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_jointToIndObsCache).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_jointToIndObsCache).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar2 = ZEXT432(0) << 0x40;
  this->_m_individualMADPDs =
       (vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
        )auVar2._0_24_;
  (this->_m_jointActionVec).
  super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar2._24_8_;
  *(undefined1 (*) [32])
   &(this->_m_individualMADPDs).
    super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar2;
  auVar3 = ZEXT464(0) << 0x20;
  this->_m_actionStepSize = (vector<unsigned_long,_std::allocator<unsigned_long>_>)auVar3._0_24_;
  this->_m_observationStepSize =
       (vector<unsigned_long,_std::allocator<unsigned_long>_>)auVar3._24_24_;
  (this->_m_stateStepSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)auVar3._48_8_;
  (this->_m_stateStepSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)auVar3._56_8_;
  *(undefined1 (*) [64])
   &(this->_m_stateStepSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = auVar3;
  this->_m_nrIndivActions = (vector<unsigned_long,_std::allocator<unsigned_long>_>)auVar3._0_24_;
  this->_m_nrIndivObs = (vector<unsigned_long,_std::allocator<unsigned_long>_>)auVar3._24_24_;
  (this->_m_indivObs).
  super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar3._48_8_;
  (this->_m_indivObs).
  super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar3._56_8_;
  *(undefined1 (*) [64])
   &(this->_m_nrIndivObs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar3;
  this_00 = (E *)__cxa_allocate_exception(0x28);
  local_98 = vtt + 1;
  E::E(this_00,"TransitionObservationIndependentMADPDiscrete: copy ctor not implemented");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

TransitionObservationIndependentMADPDiscrete::
TransitionObservationIndependentMADPDiscrete(
    const TransitionObservationIndependentMADPDiscrete&)
{
    throw(E("TransitionObservationIndependentMADPDiscrete: copy ctor not implemented"));
}